

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFBXImporterExporter.cpp
# Opt level: O0

void __thiscall
utFBXImporterExporter_importEmbeddedAsciiTest_Test::TestBody
          (utFBXImporterExporter_importEmbeddedAsciiTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  Message *message;
  AssertHelper local_598;
  Message local_590;
  uint local_584;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_550;
  Message local_548;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_;
  Message local_528;
  uint local_51c;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_5;
  Message local_500;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_4;
  Message local_4e0;
  aiReturn local_4d8 [2];
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_3;
  aiTextureMapMode modes [2];
  aiString path;
  Message local_a8;
  void *local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  aiMaterial *mat;
  Message local_78;
  uint local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50;
  void *local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  aiScene *local_20;
  aiScene *scene;
  Importer importer;
  utFBXImporterExporter_importEmbeddedAsciiTest_Test *this_local;
  
  importer.pimpl = (ImporterPimpl *)this;
  Assimp::Importer::Importer((Importer *)&scene);
  local_20 = Assimp::Importer::ReadFile
                       ((Importer *)&scene,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/FBX/embedded_ascii/box.FBX"
                        ,0x400);
  local_48 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)local_40,"nullptr","scene",&local_48,&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_6c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_68,"1u","scene->mNumMaterials",&local_6c,
             &local_20->mNumMaterials);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mat,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mat,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mat);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_20->mMaterials;
  local_a0 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiMaterial*>
            ((internal *)local_98,"nullptr","mat",&local_a0,(aiMaterial **)&gtest_ar_2.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(path.data + 0x3fc),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)(path.data + 0x3fc),&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(path.data + 0x3fc));
    testing::Message::~Message(&local_a8);
  }
  path.data[0x3f9] = '\0';
  path.data[0x3fa] = '\0';
  path.data[0x3fb] = '\0';
  path.data[0x3f8] = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  if (path.data._1016_4_ == 0) {
    aiString::aiString((aiString *)modes);
    local_4d8[1] = 0;
    pcVar2 = (char *)0x0;
    local_4d8[0] = aiMaterial::GetTexture
                             ((aiMaterial *)gtest_ar_2.message_.ptr_,aiTextureType_DIFFUSE,0,
                              (aiString *)modes,(aiTextureMapping *)0x0,(uint *)0x0,(ai_real *)0x0,
                              (aiTextureOp *)0x0,(aiTextureMapMode *)&gtest_ar_3.message_);
    testing::internal::EqHelper<false>::Compare<aiReturn,aiReturn>
              ((EqHelper<false> *)local_4d0,"aiReturn_SUCCESS",
               "mat->GetTexture(aiTextureType_DIFFUSE, 0, &path, nullptr, nullptr, nullptr, nullptr, modes)"
               ,local_4d8 + 1,local_4d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
    if (!bVar1) {
      testing::Message::Message(&local_4e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                 ,0xfc,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_4e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_4e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
    pcVar3 = aiString::C_Str((aiString *)modes);
    testing::internal::CmpHelperSTREQ
              ((internal *)local_4f8,"path.C_Str()","\"..\\\\..\\\\..\\\\Desktop\\\\uv_test.png\"",
               pcVar3,"..\\..\\..\\Desktop\\uv_test.png");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
    if (!bVar1) {
      testing::Message::Message(&local_500);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                 ,0xfd,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_500);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_500);
    }
    path.data[0x3f9] = '\0';
    path.data[0x3fa] = '\0';
    path.data[0x3fb] = '\0';
    path.data[0x3f8] = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
    if (path.data._1016_4_ == 0) {
      local_51c = 1;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                ((EqHelper<false> *)local_518,"1u","scene->mNumTextures",&local_51c,
                 &local_20->mNumTextures);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
      if (!bVar1) {
        testing::Message::Message(&local_528);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                   ,0xff,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_528);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
        testing::Message::~Message(&local_528);
      }
      path.data[0x3f9] = '\0';
      path.data[0x3fa] = '\0';
      path.data[0x3fb] = '\0';
      path.data[0x3f8] = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
      if (path.data._1016_4_ == 0) {
        testing::AssertionResult::AssertionResult<aiTexel*>
                  ((AssertionResult *)local_540,&(*local_20->mTextures)->pcData,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
        if (!bVar1) {
          testing::Message::Message(&local_548);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_6.message_,(internal *)local_540,
                     (AssertionResult *)"scene->mTextures[0]->pcData","false","true",pcVar2);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_550,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                     ,0x100,pcVar2);
          testing::internal::AssertHelper::operator=(&local_550,&local_548);
          testing::internal::AssertHelper::~AssertHelper(&local_550);
          std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_548);
        }
        path.data[0x3f9] = '\0';
        path.data[0x3fa] = '\0';
        path.data[0x3fb] = '\0';
        path.data[0x3f8] = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
        if (path.data._1016_4_ == 0) {
          local_584 = 0x6b388;
          testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                    ((EqHelper<false> *)local_580,"439176u","scene->mTextures[0]->mWidth",&local_584
                     ,&(*local_20->mTextures)->mWidth);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
          if (!bVar1) {
            testing::Message::Message(&local_590);
            message = testing::Message::operator<<
                                (&local_590,
                                 (char (*) [91])
                                 "FBX ASCII base64 compression splits data by 512Kb, it should be two parts for this texture"
                                );
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
            testing::internal::AssertHelper::AssertHelper
                      (&local_598,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                       ,0x101,pcVar2);
            testing::internal::AssertHelper::operator=(&local_598,message);
            testing::internal::AssertHelper::~AssertHelper(&local_598);
            testing::Message::~Message(&local_590);
          }
          path.data[0x3f9] = '\0';
          path.data[0x3fa] = '\0';
          path.data[0x3fb] = '\0';
          path.data[0x3f8] = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
          if (path.data._1016_4_ == 0) {
            path.data[0x3f8] = '\0';
            path.data[0x3f9] = '\0';
            path.data[0x3fa] = '\0';
            path.data[0x3fb] = '\0';
          }
        }
      }
    }
  }
  Assimp::Importer::~Importer((Importer *)&scene);
  return;
}

Assistant:

TEST_F(utFBXImporterExporter, importEmbeddedAsciiTest) {
    // see https://github.com/assimp/assimp/issues/1957
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/FBX/embedded_ascii/box.FBX", aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);

    EXPECT_EQ(1u, scene->mNumMaterials);
    aiMaterial *mat = scene->mMaterials[0];
    ASSERT_NE(nullptr, mat);

    aiString path;
    aiTextureMapMode modes[2];
    EXPECT_EQ(aiReturn_SUCCESS, mat->GetTexture(aiTextureType_DIFFUSE, 0, &path, nullptr, nullptr, nullptr, nullptr, modes));
    ASSERT_STREQ(path.C_Str(), "..\\..\\..\\Desktop\\uv_test.png");

    ASSERT_EQ(1u, scene->mNumTextures);
    ASSERT_TRUE(scene->mTextures[0]->pcData);
    ASSERT_EQ(439176u, scene->mTextures[0]->mWidth) << "FBX ASCII base64 compression splits data by 512Kb, it should be two parts for this texture";
}